

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

float ImGui::TabBarScrollClamp(ImGuiTabBar *tab_bar,float scrolling)

{
  float fVar1;
  
  fVar1 = tab_bar->WidthAllTabs - ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x);
  if (fVar1 <= scrolling) {
    scrolling = fVar1;
  }
  return (float)((uint)scrolling & -(uint)(0.0 <= scrolling));
}

Assistant:

float       GetWidth() const                    { return Max.x - Min.x; }